

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVectorVec3faBuffer<embree::Vec3fa>
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *__return_storage_ptr__,
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *vectors_in,Transformations *spaces)

{
  float *pfVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  pointer pvVar7;
  pointer pvVar8;
  size_t sVar9;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar10;
  Vec3fa *pVVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  long lVar21;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  AffineSpace3ff space;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_98;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  undefined8 uStack_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  pvVar7 = (vectors_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (vectors_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar8 == pvVar7) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::vector(__return_storage_ptr__,vectors_in);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar9 = pvVar7->size_active;
    if ((long)pvVar8 - (long)pvVar7 == 0x20) {
      if ((spaces->spaces).size_active != 0) {
        uVar24 = 0;
        do {
          local_78._8_8_ = 0;
          uStack_68 = 0;
          uStack_60 = (void *)0x0;
          if ((sVar9 != 0) &&
             (uStack_60 = alignedMalloc(sVar9 << 4,0x10), uStack_68 = sVar9, sVar9 != 0)) {
            lVar21 = 0;
            sVar23 = sVar9;
            do {
              pAVar10 = (spaces->spaces).items;
              pVVar11 = ((vectors_in->
                         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->items;
              fVar4 = *(float *)((long)&pVVar11->field_0 + lVar21);
              fVar5 = *(float *)((long)&pVVar11->field_0 + lVar21 + 4);
              fVar6 = *(float *)((long)&pVVar11->field_0 + lVar21 + 8);
              pVVar2 = &pAVar10[uVar24].l.vz;
              fVar12 = (pVVar2->field_0).m128[1];
              fVar13 = (pVVar2->field_0).m128[2];
              fVar14 = (pVVar2->field_0).m128[3];
              pVVar3 = &pAVar10[uVar24].l.vy;
              fVar15 = (pVVar3->field_0).m128[1];
              fVar16 = (pVVar3->field_0).m128[2];
              fVar17 = (pVVar3->field_0).m128[3];
              pAVar10 = pAVar10 + uVar24;
              fVar18 = (pAVar10->l).vx.field_0.m128[1];
              fVar19 = (pAVar10->l).vx.field_0.m128[2];
              fVar20 = (pAVar10->l).vx.field_0.m128[3];
              pfVar1 = (float *)((long)uStack_60 + lVar21);
              *pfVar1 = fVar4 * (pAVar10->l).vx.field_0.m128[0] +
                        fVar5 * (pVVar3->field_0).m128[0] + fVar6 * (pVVar2->field_0).m128[0];
              pfVar1[1] = fVar4 * fVar18 + fVar5 * fVar15 + fVar6 * fVar12;
              pfVar1[2] = fVar4 * fVar19 + fVar5 * fVar16 + fVar6 * fVar13;
              pfVar1[3] = fVar4 * fVar20 + fVar5 * fVar17 + fVar6 * fVar14;
              lVar21 = lVar21 + 0x10;
              sVar23 = sVar23 - 1;
            } while (sVar23 != 0);
          }
          local_78._8_8_ = uStack_68;
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)__return_storage_ptr__,
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &local_78.field_1);
          alignedFree(uStack_60);
          uVar24 = uVar24 + 1;
        } while (uVar24 < (spaces->spaces).size_active);
      }
    }
    else if (pvVar8 != pvVar7) {
      lVar21 = (long)pvVar8 - (long)pvVar7 >> 5;
      uVar24 = 0;
      do {
        Transformations::interpolate
                  ((AffineSpace3ff *)&local_78.field_1,spaces,(float)uVar24 / (float)(lVar21 - 1));
        local_98.size_active = 0;
        local_98.size_alloced = 0;
        local_98.items = (Vec3fa *)0x0;
        if ((sVar9 != 0) &&
           (local_98.items = (Vec3fa *)alignedMalloc(sVar9 << 4,0x10), local_98.size_alloced = sVar9
           , sVar9 != 0)) {
          lVar22 = 0;
          sVar23 = sVar9;
          do {
            pVVar11 = (vectors_in->
                      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar24].items;
            fVar4 = *(float *)((long)&pVVar11->field_0 + lVar22);
            fVar5 = *(float *)((long)&pVVar11->field_0 + lVar22 + 4);
            fVar6 = *(float *)((long)&pVVar11->field_0 + lVar22 + 8);
            pfVar1 = (float *)((long)&(local_98.items)->field_0 + lVar22);
            *pfVar1 = fVar4 * local_78.m128[0] + fVar5 * (float)uStack_68 + fVar6 * local_58;
            pfVar1[1] = fVar4 * local_78.m128[1] + fVar5 * uStack_68._4_4_ + fVar6 * fStack_54;
            pfVar1[2] = fVar4 * local_78.m128[2] + fVar5 * (float)uStack_60 + fVar6 * fStack_50;
            pfVar1[3] = fVar4 * local_78.m128[3] + fVar5 * uStack_60._4_4_ + fVar6 * fStack_4c;
            lVar22 = lVar22 + 0x10;
            sVar23 = sVar23 - 1;
          } while (sVar23 != 0);
        }
        local_98.size_active = local_98.size_alloced;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,&local_98);
        alignedFree(local_98.items);
        local_98.size_active = 0;
        local_98.size_alloced = 0;
        local_98.items = (Vec3fa *)0x0;
        uVar24 = uVar24 + 1;
      } while (uVar24 != lVar21 + (ulong)(lVar21 == 0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurVectorVec3faBuffer(const std::vector<avector<Vertex>>& vectors_in, const Transformations& spaces)
    {
      if (vectors_in.size() == 0)
        return vectors_in;
      
      std::vector<avector<Vertex>> vectors_out;
      const size_t num_time_steps = vectors_in.size();
      const size_t num_vertices = vectors_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> vecs(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            vecs[j] = xfmVector((AffineSpace3fa)spaces[i],vectors_in[0][j]);
          }
          vectors_out.push_back(std::move(vecs));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> vecs(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            vecs[i] = xfmVector ((AffineSpace3fa)space,vectors_in[t][i]);
          }
          vectors_out.push_back(std::move(vecs));
        }
      }
      return vectors_out;
    }